

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::AssignDescriptorsHelper::AssignMessageDescriptor
          (AssignDescriptorsHelper *this,Descriptor *descriptor)

{
  int iVar1;
  int iVar2;
  Descriptor *pDVar3;
  undefined4 extraout_var;
  Reflection *pRVar4;
  DescriptorPool *pool;
  EnumDescriptor *descriptor_00;
  int local_88;
  int i_1;
  ReflectionSchema local_70;
  ClassDataFull *local_28;
  ClassDataFull *class_data;
  Descriptor *pDStack_18;
  int i;
  Descriptor *descriptor_local;
  AssignDescriptorsHelper *this_local;
  
  pDStack_18 = descriptor;
  descriptor_local = (Descriptor *)this;
  for (class_data._4_4_ = 0; iVar2 = class_data._4_4_,
      iVar1 = Descriptor::nested_type_count(pDStack_18), iVar2 < iVar1;
      class_data._4_4_ = class_data._4_4_ + 1) {
    pDVar3 = Descriptor::nested_type(pDStack_18,class_data._4_4_);
    AssignMessageDescriptor(this,pDVar3);
  }
  if (*this->default_instance_data_ != (Message *)0x0) {
    iVar2 = (*((*this->default_instance_data_)->super_MessageLite)._vptr_MessageLite[4])();
    local_28 = internal::ClassData::full((ClassData *)CONCAT44(extraout_var,iVar2));
    if (local_28->descriptor_table != (DescriptorTable *)0x0) {
      local_28->descriptor = pDStack_18;
      pRVar4 = (Reflection *)operator_new(0x70);
      pDVar3 = pDStack_18;
      anon_unknown_6::MigrationToReflectionSchema
                (&local_70,this->default_instance_data_,this->offsets_,*this->schemas_);
      pool = DescriptorPool::internal_generated_pool();
      Reflection::Reflection(pRVar4,pDVar3,&local_70,pool,this->factory_);
      pRVar4 = internal::OnShutdownDelete<google::protobuf::Reflection>(pRVar4);
      local_28->reflection = pRVar4;
    }
  }
  for (local_88 = 0; iVar2 = Descriptor::enum_type_count(pDStack_18), local_88 < iVar2;
      local_88 = local_88 + 1) {
    descriptor_00 = Descriptor::enum_type(pDStack_18,local_88);
    AssignEnumDescriptor(this,descriptor_00);
  }
  this->schemas_ = this->schemas_ + 1;
  this->default_instance_data_ = this->default_instance_data_ + 1;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    // If there is no default instance we only want to initialize the descriptor
    // without updating the reflection.
    if (default_instance_data_[0] != nullptr) {
      auto& class_data = default_instance_data_[0]->GetClassData()->full();
      // If there is no descriptor_table in the class data, then it is not
      // interested in receiving reflection information either.
      if (class_data.descriptor_table != nullptr) {
        class_data.descriptor = descriptor;

        class_data.reflection = OnShutdownDelete(new Reflection(
            descriptor,
            MigrationToReflectionSchema(default_instance_data_, offsets_,
                                        *schemas_),
            DescriptorPool::internal_generated_pool(), factory_));
      }
    }
    for (int i = 0; i < descriptor->enum_type_count(); i++) {
      AssignEnumDescriptor(descriptor->enum_type(i));
    }
    schemas_++;
    default_instance_data_++;
  }